

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::join(Path *__return_storage_ptr__,Path *this,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  undefined1 local_21;
  string *local_20;
  string *str_local;
  Path *this_local;
  Path *path;
  
  local_21 = 0;
  local_20 = str;
  str_local = &this->m_path;
  this_local = __return_storage_ptr__;
  std::operator+(local_68,(char *)this);
  std::operator+(local_48,local_68);
  Path(__return_storage_ptr__,local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Path Path::join(std::string str) const
{
  Path path(m_path + "/" + str);
  return path;
}